

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetNameTest.cpp
# Opt level: O1

void __thiscall GetNameTest::SubmitPacket(GetNameTest *this,uint8_t *packet,uint32_t length)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  bool bVar4;
  int iVar5;
  uint32_t start;
  uint32_t start_00;
  char *__format;
  FILE *__stream;
  ushort uVar6;
  uint uVar7;
  int nb_name_parts;
  uint32_t flags;
  uint32_t previous_offset;
  uint32_t tld_offset;
  char text [256];
  uint local_148;
  uint32_t local_144;
  uint32_t local_140;
  uint32_t local_13c;
  uint8_t local_138 [264];
  
  local_13c = 0;
  local_140 = 0;
  local_148 = 0;
  bVar4 = DnsStats::GetTLD(packet,length,0xc,&local_13c,&local_140,(int *)&local_148);
  uVar6 = *(ushort *)(packet + 4);
  uVar1 = *(ushort *)(packet + 6);
  uVar2 = *(ushort *)(packet + 8);
  uVar3 = *(ushort *)(packet + 10);
  if (bVar4) {
    if ((ulong)local_140 != 0) {
      DnsStats::NormalizeNamePart
                ((uint)packet[local_140],packet + (local_140 + 1),local_138,0x100,&local_144);
      fprintf((FILE *)this->test_out,"%s.",local_138);
    }
    DnsStats::NormalizeNamePart
              ((uint)packet[local_13c],packet + (local_13c + 1),local_138,0x100,&local_144);
    fputs((char *)local_138,(FILE *)this->test_out);
    __stream = (FILE *)this->test_out;
    __format = " %d\n";
  }
  else {
    __stream = (FILE *)this->test_out;
    __format = "??? %d\n";
  }
  fprintf(__stream,__format,(ulong)local_148);
  start = 0xc;
  start_00 = start;
  if ((0xc < length) && (uVar6 = uVar6 << 8 | uVar6 >> 8, uVar6 != 0)) {
    uVar7 = 1;
    do {
      iVar5 = SubmitName(this,packet,length,start);
      start = iVar5 + 4;
      start_00 = length;
      if (length <= start) break;
      bVar4 = uVar7 < uVar6;
      start_00 = start;
      uVar7 = uVar7 + 1;
    } while (bVar4);
  }
  if ((start_00 < length) && (uVar6 = uVar1 << 8 | uVar1 >> 8, uVar6 != 0)) {
    uVar7 = 1;
    do {
      start_00 = SubmitRecord(this,packet,length,start_00);
      if (length <= start_00) break;
      bVar4 = uVar7 < uVar6;
      uVar7 = uVar7 + 1;
    } while (bVar4);
  }
  if ((start_00 < length) && (uVar6 = uVar2 << 8 | uVar2 >> 8, uVar6 != 0)) {
    uVar7 = 1;
    do {
      start_00 = SubmitRecord(this,packet,length,start_00);
      if (length <= start_00) break;
      bVar4 = uVar7 < uVar6;
      uVar7 = uVar7 + 1;
    } while (bVar4);
  }
  if ((start_00 < length) && (uVar6 = uVar3 << 8 | uVar3 >> 8, uVar6 != 0)) {
    uVar7 = 1;
    do {
      start_00 = SubmitRecord(this,packet,length,start_00);
      if (length <= start_00) {
        return;
      }
      bVar4 = uVar7 < uVar6;
      uVar7 = uVar7 + 1;
    } while (bVar4);
  }
  return;
}

Assistant:

void GetNameTest::SubmitPacket(uint8_t * packet, uint32_t length)
{
    uint32_t qdcount = 0;
    uint32_t ancount = 0;
    uint32_t nscount = 0;
    uint32_t arcount = 0;
    uint32_t parse_index = 12;
    uint32_t tld_offset = 0;
    uint32_t previous_offset = 0;
    int nb_name_parts = 0;
    bool gotTld = DnsStats::GetTLD(packet, length, 12, &tld_offset, &previous_offset, &nb_name_parts);

    qdcount = (packet[4] << 8) | packet[5];
    ancount = (packet[6] << 8) | packet[7];
    nscount = (packet[8] << 8) | packet[9];
    arcount = (packet[10] << 8) | packet[11];

    if (gotTld) {
        char text[256];
        uint32_t flags;

        if (previous_offset != 0) {
            (void) DnsStats::NormalizeNamePart(packet[previous_offset],
                &packet[previous_offset + 1], (uint8_t *)text, sizeof(text), &flags);
            fprintf(test_out, "%s.", text);
        }
        (void) DnsStats::NormalizeNamePart(packet[tld_offset],
            &packet[tld_offset + 1], (uint8_t *)text, sizeof(text), &flags);
        fprintf(test_out, "%s", text);

        fprintf(test_out, " %d\n", nb_name_parts);
    }
    else {
        fprintf(test_out, "??? %d\n", nb_name_parts);
    }

    for (uint32_t i = 0; i < qdcount; i++)
    {
        if (parse_index >= length)
        {
            break;
        }
        else
        {
            parse_index = SubmitQuery(packet, length, parse_index);
        }
    }

    for (uint32_t i = 0; i < ancount; i++)
    {
        if (parse_index >= length)
        {
            break;
        }
        else
        {
            parse_index = SubmitRecord(packet, length, parse_index);
        }
    }

    for (uint32_t i = 0; i < nscount; i++)
    {
        if (parse_index >= length)
        {
            break;
        }
        else
        {
            parse_index = SubmitRecord(packet, length, parse_index);
        }
    }

    for (uint32_t i = 0; i < arcount; i++)
    {
        if (parse_index >= length)
        {
            break;
        }
        else
        {
            parse_index = SubmitRecord(packet, length, parse_index);
        }
    }
}